

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O0

int * Hsh_IntManLookup(Hsh_IntMan_t *p,uint *pData)

{
  Vec_Int_t *p_00;
  int nTableSize;
  int iVar1;
  Hsh_IntObj_t *pHVar2;
  uint *__s2;
  int *local_30;
  int *pPlace;
  Hsh_IntObj_t *pObj;
  uint *pData_local;
  Hsh_IntMan_t *p_local;
  
  p_00 = p->vTable;
  iVar1 = p->nSize;
  nTableSize = Vec_IntSize(p->vTable);
  iVar1 = Hsh_IntManHash(pData,iVar1,nTableSize);
  local_30 = Vec_IntEntryP(p_00,iVar1);
  while (pHVar2 = Hsh_IntObj(p,*local_30), pHVar2 != (Hsh_IntObj_t *)0x0) {
    __s2 = Hsh_IntData(p,pHVar2->iData);
    iVar1 = memcmp(pData,__s2,(long)p->nSize << 2);
    if (iVar1 == 0) {
      return local_30;
    }
    local_30 = &pHVar2->iNext;
  }
  if (*local_30 == -1) {
    return local_30;
  }
  __assert_fail("*pPlace == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecHsh.h"
                ,0x9a,"int *Hsh_IntManLookup(Hsh_IntMan_t *, unsigned int *)");
}

Assistant:

static inline int * Hsh_IntManLookup( Hsh_IntMan_t * p, unsigned * pData )
{
    Hsh_IntObj_t * pObj;
    int * pPlace = Vec_IntEntryP( p->vTable, Hsh_IntManHash(pData, p->nSize, Vec_IntSize(p->vTable)) );
    for ( ; (pObj = Hsh_IntObj(p, *pPlace)); pPlace = &pObj->iNext )
        if ( !memcmp( pData, Hsh_IntData(p, pObj->iData), sizeof(int) * p->nSize ) )
            return pPlace;
    assert( *pPlace == -1 );
    return pPlace;
}